

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCModule.c
# Opt level: O1

cs_err PPC_global_init(cs_struct *ud)

{
  MCRegisterInfo *MRI;
  
  MRI = (MCRegisterInfo *)(*cs_mem_malloc)(0x58);
  PPC_init(MRI);
  ud->printer = PPC_printInst;
  ud->printer_info = MRI;
  ud->getinsn_info = MRI;
  ud->disasm = PPC_getInstruction;
  ud->post_printer = PPC_post_printer;
  ud->reg_name = PPC_reg_name;
  ud->insn_id = PPC_get_insn_id;
  ud->insn_name = PPC_insn_name;
  ud->group_name = PPC_group_name;
  return CS_ERR_OK;
}

Assistant:

cs_err PPC_global_init(cs_struct *ud)
{
	MCRegisterInfo *mri;
	mri = (MCRegisterInfo *) cs_mem_malloc(sizeof(*mri));

	PPC_init(mri);
	ud->printer = PPC_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->disasm = PPC_getInstruction;
	ud->post_printer = PPC_post_printer;

	ud->reg_name = PPC_reg_name;
	ud->insn_id = PPC_get_insn_id;
	ud->insn_name = PPC_insn_name;
	ud->group_name = PPC_group_name;

	return CS_ERR_OK;
}